

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O0

void ffstat(FILE *ffp,buffer *bp)

{
  int iVar1;
  undefined1 local_a8 [8];
  stat sb;
  buffer *bp_local;
  FILE *ffp_local;
  
  if (bp != (buffer *)0x0) {
    sb.__glibc_reserved[2] = (__syscall_slong_t)bp;
    iVar1 = fileno((FILE *)ffp);
    iVar1 = fstat(iVar1,(stat *)local_a8);
    if (iVar1 == 0) {
      *(uint *)(sb.__glibc_reserved[2] + 0x880) = (uint)sb.st_nlink | 0x8000;
      *(undefined4 *)(sb.__glibc_reserved[2] + 0x878) = sb.st_nlink._4_4_;
      *(__mode_t *)(sb.__glibc_reserved[2] + 0x87c) = sb.st_mode;
      *(__syscall_slong_t *)(sb.__glibc_reserved[2] + 0x888) = sb.st_atim.tv_nsec;
      *(__time_t *)(sb.__glibc_reserved[2] + 0x890) = sb.st_mtim.tv_sec;
      *(byte *)(sb.__glibc_reserved[2] + 0x5b) = *(byte *)(sb.__glibc_reserved[2] + 0x5b) & 0x9f;
    }
  }
  return;
}

Assistant:

void
ffstat(FILE *ffp, struct buffer *bp)
{
	struct stat	sb;

	if (bp && fstat(fileno(ffp), &sb) == 0) {
		/* set highorder bit to make sure this isn't all zero */
		bp->b_fi.fi_mode = sb.st_mode | 0x8000;
		bp->b_fi.fi_uid = sb.st_uid;
		bp->b_fi.fi_gid = sb.st_gid;
		bp->b_fi.fi_mtime = sb.st_mtim;
		/* Clear the ignore flag */
		bp->b_flag &= ~(BFIGNDIRTY | BFDIRTY);
	}
}